

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_dist_wtd_convolve_y_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  uint8_t uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int16_t *piVar10;
  byte bVar11;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  InterpFilterParams *in_stack_00000008;
  int32_t tmp;
  int k;
  int32_t res;
  int x;
  int y;
  int16_t *y_filter;
  int round_bits;
  int round_offset;
  int offset_bits;
  int bd;
  int bits;
  int fo_vert;
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  
  lVar4 = *(long *)(_x + 2);
  iVar2 = _x[4];
  uVar1 = in_stack_00000008->taps;
  iVar3 = _x[5];
  cVar5 = '\x16' - (char)_x[5];
  iVar7 = (1 << (cVar5 - (char)_x[6] & 0x1fU)) + (1 << ((cVar5 - (char)_x[6]) - 1U & 0x1f));
  bVar11 = ('\x0e' - (char)_x[5]) - (char)_x[6];
  piVar10 = av1_get_interp_filter_subpel_kernel(in_stack_00000008,k & 0xf);
  for (local_5c = 0; local_5c < in_R9D; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < in_R8D; local_60 = local_60 + 1) {
      local_64 = 0;
      for (local_68 = 0; local_68 < (int)(uint)in_stack_00000008->taps; local_68 = local_68 + 1) {
        local_64 = (int)piVar10[local_68] *
                   (uint)*(byte *)(in_RDI + (int)(((local_5c - (uVar1 / 2 - 1)) + local_68) * in_ESI
                                                 + local_60)) + local_64;
      }
      iVar8 = ((1 << (7U - (char)iVar3 & 0x1f)) * local_64 + ((1 << ((byte)_x[6] & 0x1f)) >> 1) >>
              ((byte)_x[6] & 0x1f)) + iVar7;
      if (*_x == 0) {
        *(short *)(lVar4 + (long)(local_5c * iVar2 + local_60) * 2) = (short)iVar8;
      }
      else {
        uVar9 = (uint)*(ushort *)(lVar4 + (long)(local_5c * iVar2 + local_60) * 2);
        if (_x[9] == 0) {
          local_6c = (int)(iVar8 + uVar9) >> 1;
        }
        else {
          local_6c = (int)(uVar9 * _x[10] + iVar8 * _x[0xb]) >> 4;
        }
        uVar6 = clip_pixel((local_6c - iVar7) + ((1 << (bVar11 & 0x1f)) >> 1) >> (bVar11 & 0x1f));
        *(uint8_t *)(in_RDX + (local_5c * in_ECX + local_60)) = uVar6;
      }
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_c(const uint8_t *src, int src_stride, uint8_t *dst,
                               int dst_stride, int w, int h,
                               const InterpFilterParams *filter_params_y,
                               const int subpel_y_qn,
                               ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      res *= (1 << bits);
      res = ROUND_POWER_OF_TWO(res, conv_params->round_1) + round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel(ROUND_POWER_OF_TWO(tmp, round_bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}